

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationOperation.cpp
# Opt level: O2

void __thiscall
vkt::synchronization::anon_unknown_0::IndirectBuffer::ReadSupport::initPrograms
          (ReadSupport *this,SourceCollections *programCollection)

{
  ostream *poVar1;
  char *pcVar2;
  ProgramSources *pPVar3;
  allocator<char> local_4f1;
  string local_4f0;
  undefined1 local_4d0 [40];
  string local_4a8;
  ostringstream src;
  ostringstream main;
  ostringstream decl;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&decl);
  poVar1 = std::operator<<((ostream *)&decl,
                           "layout(set = 0, binding = 0, std140) coherent buffer Data {\n");
  poVar1 = std::operator<<(poVar1,"    uint value;\n");
  std::operator<<(poVar1,"} sb_out;\n");
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&main);
  std::operator<<((ostream *)&main,"    atomicAdd(sb_out.value, 1u);\n");
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&src);
  pcVar2 = glu::getGLSLVersionDeclaration(GLSL_VERSION_440);
  poVar1 = std::operator<<((ostream *)&src,pcVar2);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"layout(location = 0) in vec4 v_in_position;\n");
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"out ");
  poVar1 = std::operator<<(poVar1,"gl_PerVertex {\n    vec4 gl_Position;\n}");
  poVar1 = std::operator<<(poVar1,";\n");
  poVar1 = std::operator<<(poVar1,"\n");
  std::__cxx11::stringbuf::str();
  poVar1 = std::operator<<(poVar1,(string *)local_4d0);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"void main (void)\n");
  poVar1 = std::operator<<(poVar1,"{\n");
  poVar1 = std::operator<<(poVar1,"    gl_Position = v_in_position;\n");
  std::__cxx11::stringbuf::str();
  poVar1 = std::operator<<(poVar1,(string *)&local_4f0);
  std::operator<<(poVar1,"}\n");
  std::__cxx11::string::~string((string *)&local_4f0);
  std::__cxx11::string::~string((string *)local_4d0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4f0,"read_ib_vert",&local_4f1)
  ;
  pPVar3 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,&local_4f0);
  std::__cxx11::stringbuf::str();
  glu::VertexSource::VertexSource((VertexSource *)local_4d0,&local_4a8);
  glu::ProgramSources::operator<<(pPVar3,(ShaderSource *)local_4d0);
  std::__cxx11::string::~string((string *)(local_4d0 + 8));
  std::__cxx11::string::~string((string *)&local_4a8);
  std::__cxx11::string::~string((string *)&local_4f0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&src);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&src);
  pcVar2 = glu::getGLSLVersionDeclaration(GLSL_VERSION_440);
  poVar1 = std::operator<<((ostream *)&src,pcVar2);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"layout(location = 0) out vec4 o_color;\n");
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"void main (void)\n");
  poVar1 = std::operator<<(poVar1,"{\n");
  poVar1 = std::operator<<(poVar1,"    o_color = vec4(1.0);\n");
  std::operator<<(poVar1,"}\n");
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4f0,"read_ib_frag",&local_4f1)
  ;
  pPVar3 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,&local_4f0);
  std::__cxx11::stringbuf::str();
  glu::FragmentSource::FragmentSource((FragmentSource *)local_4d0,&local_4a8);
  glu::ProgramSources::operator<<(pPVar3,(ShaderSource *)local_4d0);
  std::__cxx11::string::~string((string *)(local_4d0 + 8));
  std::__cxx11::string::~string((string *)&local_4a8);
  std::__cxx11::string::~string((string *)&local_4f0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&src);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&src);
  pcVar2 = glu::getGLSLVersionDeclaration(GLSL_VERSION_440);
  poVar1 = std::operator<<((ostream *)&src,pcVar2);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"layout(local_size_x = 1) in;\n");
  poVar1 = std::operator<<(poVar1,"\n");
  std::__cxx11::stringbuf::str();
  poVar1 = std::operator<<(poVar1,(string *)local_4d0);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"void main (void)\n");
  poVar1 = std::operator<<(poVar1,"{\n");
  std::__cxx11::stringbuf::str();
  poVar1 = std::operator<<(poVar1,(string *)&local_4f0);
  std::operator<<(poVar1,"}\n");
  std::__cxx11::string::~string((string *)&local_4f0);
  std::__cxx11::string::~string((string *)local_4d0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4f0,"read_ib_comp",&local_4f1)
  ;
  pPVar3 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,&local_4f0);
  std::__cxx11::stringbuf::str();
  glu::ComputeSource::ComputeSource((ComputeSource *)local_4d0,&local_4a8);
  glu::ProgramSources::operator<<(pPVar3,(ShaderSource *)local_4d0);
  std::__cxx11::string::~string((string *)(local_4d0 + 8));
  std::__cxx11::string::~string((string *)&local_4a8);
  std::__cxx11::string::~string((string *)&local_4f0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&src);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&main);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&decl);
  return;
}

Assistant:

void initPrograms (SourceCollections& programCollection) const
	{
		std::ostringstream decl;
		decl << "layout(set = 0, binding = 0, std140) coherent buffer Data {\n"
			 << "    uint value;\n"
			 << "} sb_out;\n";

		std::ostringstream main;
		main << "    atomicAdd(sb_out.value, 1u);\n";

		// Vertex
		{
			std::ostringstream src;
			src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_440) << "\n"
				<< "\n"
				<< "layout(location = 0) in vec4 v_in_position;\n"
				<< "\n"
				<< "out " << s_perVertexBlock << ";\n"
				<< "\n"
				<< decl.str()
				<< "\n"
				<< "void main (void)\n"
				<< "{\n"
				<< "    gl_Position = v_in_position;\n"
				<< main.str()
				<< "}\n";

			programCollection.glslSources.add("read_ib_vert") << glu::VertexSource(src.str());
		}

		// Fragment
		{
			std::ostringstream src;
			src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_440) << "\n"
				<< "\n"
				<< "layout(location = 0) out vec4 o_color;\n"
				<< "\n"
				<< "void main (void)\n"
				<< "{\n"
				<< "    o_color = vec4(1.0);\n"
				<< "}\n";

			programCollection.glslSources.add("read_ib_frag") << glu::FragmentSource(src.str());
		}

		// Compute
		{
			std::ostringstream src;
			src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_440) << "\n"
				<< "\n"
				<< "layout(local_size_x = 1) in;\n"
				<< "\n"
				<< decl.str()
				<< "\n"
				<< "void main (void)\n"
				<< "{\n"
				<< main.str()
				<< "}\n";

			programCollection.glslSources.add("read_ib_comp") << glu::ComputeSource(src.str());
		}
	}